

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

Array<unsigned_char> *
kj::anon_unknown_75::readAll
          (Array<unsigned_char> *__return_storage_ptr__,InputStream *input,uint64_t limit,
          bool nulTerminate)

{
  RemoveConst<kj::Array<unsigned_char>_> *pRVar1;
  Array<unsigned_char> *pAVar2;
  int iVar3;
  Exception *__src;
  undefined4 extraout_var;
  uchar *puVar4;
  Array<unsigned_char> *pAVar5;
  Array<unsigned_char> *extraout_RAX;
  Array<unsigned_char> *pAVar6;
  undefined7 in_register_00000009;
  size_t sVar7;
  uchar *__dest;
  Array<unsigned_char> *p;
  uint64_t elementCount;
  byte *pos;
  undefined4 local_d4;
  uint64_t limit_local;
  Vector<kj::Array<unsigned_char>_> parts;
  DebugComparison<unsigned_char_*&,_unsigned_char_*> _kjCondition;
  Fault f_1;
  Fault f;
  ulong __n;
  undefined4 extraout_var_00;
  
  local_d4 = (undefined4)CONCAT71(in_register_00000009,nulTerminate);
  parts.builder.ptr = (Array<unsigned_char> *)0x0;
  parts.builder.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
  parts.builder.endPtr = (Array<unsigned_char> *)0x0;
  parts.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  _kjCondition.right = (uchar *)((ulong)_kjCondition.right & 0xffffffff00000000);
  _kjCondition.result = limit != 0;
  limit_local = limit;
  if (_kjCondition.result) {
    do {
      _kjCondition.left = (uchar **)&limit_local;
      _kjCondition.op.content.size_ = 4;
      _kjCondition.op.content.ptr = " > ";
      elementCount = limit_local;
      if (0xfff < limit_local) {
        elementCount = 0x1000;
      }
      __src = (Exception *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                         (_func_void_void_ptr *)0x0);
      f.exception = __src;
      iVar3 = (*input->_vptr_InputStream[2])(input,__src,elementCount,elementCount);
      __n = CONCAT44(extraout_var,iVar3);
      limit_local = limit_local - __n;
      if (__n < elementCount) {
        sVar7 = ((ulong)((long)parts.builder.pos - (long)parts.builder.ptr) >> 3) *
                -0x5555555555555000 + nulTerminate + __n;
        puVar4 = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                                    (1,sVar7,sVar7,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
        pRVar1 = parts.builder.pos;
        __return_storage_ptr__->ptr = puVar4;
        __return_storage_ptr__->size_ = sVar7;
        __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        __dest = puVar4;
        for (pAVar6 = parts.builder.ptr; pos = __dest, pAVar6 != pRVar1; pAVar6 = pAVar6 + 1) {
          memcpy(__dest,pAVar6->ptr,0x1000);
          __dest = __dest + 0x1000;
        }
        memcpy(__dest,__src,__n);
        pAVar5 = (Array<unsigned_char> *)(pos + __n);
        pAVar6 = pAVar5;
        if ((char)local_d4 != '\0') {
          pAVar6 = (Array<unsigned_char> *)((long)&pAVar5->ptr + 1);
          *(undefined1 *)&pAVar5->ptr = 0;
        }
        _kjCondition.right = puVar4 + sVar7;
        _kjCondition.left = &pos;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = pAVar6 == (Array<unsigned_char> *)_kjCondition.right;
        pos = (byte *)pAVar6;
        if (!_kjCondition.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char*&,unsigned_char*>&>
                    (&f_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                     ,0x5c,FAILED,"pos == result.end()","_kjCondition,",&_kjCondition);
          kj::_::Debug::Fault::fatal(&f_1);
        }
        if (__src != (Exception *)0x0) {
          f.exception = (Exception *)0x0;
          kj::_::HeapArrayDisposer::disposeImpl
                    ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,__src,1,elementCount,
                     elementCount,(_func_void_void_ptr *)0x0);
          pAVar6 = extraout_RAX;
        }
        pAVar2 = parts.builder.endPtr;
        pRVar1 = parts.builder.pos;
        pAVar5 = parts.builder.ptr;
        if (__n < elementCount) {
          if (parts.builder.ptr != (Array<unsigned_char> *)0x0) {
            parts.builder.ptr = (Array<unsigned_char> *)0x0;
            parts.builder.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
            parts.builder.endPtr = (Array<unsigned_char> *)0x0;
            iVar3 = (**(parts.builder.disposer)->_vptr_ArrayDisposer)
                              (parts.builder.disposer,pAVar5,0x18,
                               ((long)pRVar1 - (long)pAVar5 >> 3) * -0x5555555555555555,
                               ((long)pAVar2 - (long)pAVar5 >> 3) * -0x5555555555555555,
                               ArrayDisposer::Dispose_<kj::Array<unsigned_char>_>::destruct);
            pAVar6 = (Array<unsigned_char> *)CONCAT44(extraout_var_00,iVar3);
          }
          return pAVar6;
        }
      }
      else {
        if (parts.builder.pos == parts.builder.endPtr) {
          sVar7 = ((long)parts.builder.pos - (long)parts.builder.ptr >> 3) * 0x5555555555555556;
          if (parts.builder.pos == parts.builder.ptr) {
            sVar7 = 4;
          }
          Vector<kj::Array<unsigned_char>_>::setCapacity(&parts,sVar7);
        }
        (parts.builder.pos)->ptr = (uchar *)__src;
        (parts.builder.pos)->size_ = elementCount;
        (parts.builder.pos)->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        parts.builder.pos = parts.builder.pos + 1;
      }
      _kjCondition.right = (uchar *)((ulong)_kjCondition.right & 0xffffffff00000000);
      _kjCondition.result = limit_local != 0;
    } while (_kjCondition.result);
  }
  _kjCondition.left = (uchar **)&limit_local;
  _kjCondition.op.content.size_ = 4;
  _kjCondition.op.content.ptr = " > ";
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[26]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
             ,0x4e,FAILED,"limit > 0","_kjCondition,\"Reached limit before EOF.\"",
             (DebugComparison<unsigned_long_&,_int> *)&_kjCondition,
             (char (*) [26])"Reached limit before EOF.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Array<byte> readAll(InputStream& input, uint64_t limit, bool nulTerminate) {
  Vector<Array<byte>> parts;
  constexpr size_t BLOCK_SIZE = 4096;

  for (;;) {
    KJ_REQUIRE(limit > 0, "Reached limit before EOF.");
    auto part = heapArray<byte>(kj::min(BLOCK_SIZE, limit));
    size_t n = input.tryRead(part, part.size());
    limit -= n;
    if (n < part.size()) {
      auto result = heapArray<byte>(parts.size() * BLOCK_SIZE + n + nulTerminate);
      byte* pos = result.begin();
      for (auto& p: parts) {
        memcpy(pos, p.begin(), BLOCK_SIZE);
        pos += BLOCK_SIZE;
      }
      memcpy(pos, part.begin(), n);
      pos += n;
      if (nulTerminate) *pos++ = '\0';
      KJ_ASSERT(pos == result.end());
      return result;
    } else {
      parts.add(kj::mv(part));
    }
  }
}